

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::ArrayLitExpr::ArrayLitExpr
          (ArrayLitExpr *this,Lexer *lexer,Position *pos,
          list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *exprs)

{
  bool bVar1;
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *exprs_local;
  Position *pos_local;
  Lexer *lexer_local;
  ArrayLitExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_ARRLIT,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ArrayLitExpr_00176a60;
  std::__cxx11::
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::list(&this->exprs,exprs);
  bVar1 = std::__cxx11::
          list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::empty(&this->exprs);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->exprs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x3b6,
                  "pfederc::ArrayLitExpr::ArrayLitExpr(const Lexer &, const Position &, std::list<std::unique_ptr<Expr>> &&)"
                 );
  }
  _setParents<pfederc::Expr>(&this->exprs,&this->super_Expr);
  return;
}

Assistant:

ArrayLitExpr::ArrayLitExpr(const Lexer &lexer, const Position &pos,
     std::list<std::unique_ptr<Expr>> &&exprs) noexcept
     : Expr(lexer, ExprType::EXPR_ARRLIT, pos),
       exprs(std::move(exprs)) {
  assert(!this->exprs.empty());

  _setParents(this->exprs, this);
}